

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_isset_set(t_dart_generator *this,ostream *out,t_field *field)

{
  bool bVar1;
  ostream *poVar2;
  t_dart_generator *this_00;
  string field_name;
  string local_60;
  string local_40;
  
  bVar1 = type_can_be_null(this,field->type_);
  if (!bVar1) {
    this_00 = (t_dart_generator *)&field->name_;
    std::__cxx11::string::string((string *)&local_40,(string *)this_00);
    get_member_name(&local_60,this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"this.__isset_");
    poVar2 = std::operator<<(poVar2,(string *)&local_60);
    poVar2 = std::operator<<(poVar2," = true;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void t_dart_generator::generate_isset_set(ostream& out, t_field* field) {
  if (!type_can_be_null(field->get_type())) {
    string field_name = get_member_name(field->get_name());
    indent(out) << "this.__isset_" << field_name << " = true;" << endl;
  }
}